

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_info.c
# Opt level: O1

void info_print_output(lyout *out,lys_node *node)

{
  lys_node *plVar1;
  
  plVar1 = lys_parent(node);
  if (plVar1 != (lys_node *)0x0) {
    plVar1 = lys_parent(node);
    if (plVar1->nodetype == LYS_RPC) {
      plVar1 = lys_parent(node);
      ly_print(out,"%-*s%s\n",0xb,"Output of: ",plVar1->name);
      info_print_typedef(out,(lys_tpdf *)node[1].name,node->padding[2]);
      info_print_must(out,(lys_restr *)node[1].dsc,node->padding[3]);
      info_print_snode(out,node,node->child,"Children:");
      return;
    }
  }
  __assert_fail("lys_parent(node) && lys_parent(node)->nodetype == LYS_RPC",
                "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/printer_info.c"
                ,0x3ab,"void info_print_output(struct lyout *, const struct lys_node *)");
}

Assistant:

static void
info_print_output(struct lyout *out, const struct lys_node *node)
{
    struct lys_node_inout *output = (struct lys_node_inout *)node;

    assert(lys_parent(node) && lys_parent(node)->nodetype == LYS_RPC);

    ly_print(out, "%-*s%s\n", INDENT_LEN, "Output of: ", lys_parent(node)->name);
    info_print_typedef(out, output->tpdf, output->tpdf_size);
    info_print_must(out, output->must, output->must_size);

    info_print_snode(out, (struct lys_node *)output, output->child, "Children:");
}